

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O1

bool __thiscall Http2::FrameReader::readHeader(FrameReader *this,QIODevice *socket)

{
  pointer puVar1;
  long lVar2;
  
  if ((ulong)((long)(this->frame).buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->frame).buffer.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) < 9) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&(this->frame).buffer,9);
  }
  puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)this->offset <
      (ulong)((long)(this->frame).buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1)) {
    lVar2 = QIODevice::read((char *)socket,(longlong)(puVar1 + this->offset));
    if (0 < lVar2) {
      this->offset = this->offset + (int)lVar2;
    }
    return this->offset == 9;
  }
  readHeader();
}

Assistant:

bool FrameReader::readHeader(QIODevice &socket)
{
    Q_ASSERT(offset < frameHeaderSize);

    auto &buffer = frame.buffer;
    if (buffer.size() < frameHeaderSize)
        buffer.resize(frameHeaderSize);

    const auto chunkSize = socket.read(reinterpret_cast<char *>(&buffer[offset]),
                                       frameHeaderSize - offset);
    if (chunkSize > 0)
        offset += chunkSize;

    return offset == frameHeaderSize;
}